

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O3

void uo_tcp_conn_send(uo_cb *cb)

{
  int wfd;
  uo_tcp_conn *tcp_conn;
  size_t len;
  size_t sVar1;
  uo_buf buf;
  
  tcp_conn = (uo_tcp_conn *)uo_cb_stack_index(cb,0);
  buf = tcp_conn->wbuf;
  len = uo_buf_get_len_before_ptr(buf);
  if (len != 0) {
    wfd = tcp_conn->sockfd;
    do {
      sVar1 = uo_io_write(wfd,buf,len);
      if (sVar1 == 0) {
        uo_cb_stack_pop(cb);
        uo_tcp_conn_next_state(tcp_conn,'c');
        goto LAB_00102db0;
      }
      buf = buf + sVar1;
      len = len - sVar1;
    } while (len != 0);
  }
  uo_cb_append_cb(cb,tcp_conn->evt_handlers->after_send);
  uo_cb_append_func(cb,uo_tcp_conn_after_send);
  uo_cb_append_func(cb,uo_tcp_conn_advance);
LAB_00102db0:
  uo_cb_invoke(cb);
  return;
}

Assistant:

static void uo_tcp_conn_send(
    uo_cb *cb)
{
    uo_tcp_conn *tcp_conn = uo_cb_stack_index(cb, 0);

    size_t wlen;
    unsigned char *p = tcp_conn->wbuf;
    size_t len = uo_buf_get_len_before_ptr(p);
    int wfd = tcp_conn->sockfd;

    while (len)
    {
        // TODO: handle errors properly
        if ((wlen = uo_io_write(wfd, p, len)) == 0)
        {
            uo_cb_stack_pop(cb); // remove error code
            uo_tcp_conn_next_close(tcp_conn);
            uo_cb_invoke(cb);
            return;
        }

        len -= wlen;
        p += wlen;
    }

    uo_cb_append(cb, tcp_conn->evt_handlers->after_send);
    uo_cb_append(cb, uo_tcp_conn_after_send);
    uo_cb_append(cb, uo_tcp_conn_advance);

    uo_cb_invoke(cb);
}